

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_query_node.cpp
# Opt level: O0

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
duckdb::SelectNode::Deserialize(Deserializer *deserializer)

{
  Deserializer *pDVar1;
  pointer tag;
  pointer this;
  unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_> *in_RSI;
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> in_RDI;
  unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> result;
  pointer in_stack_ffffffffffffff28;
  SelectNode *in_stack_ffffffffffffff30;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *in_stack_ffffffffffffff38;
  unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_> *puVar2;
  Deserializer *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  field_id_t fVar3;
  Deserializer *in_stack_ffffffffffffff50;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  field_id_t field_id;
  Deserializer *in_stack_ffffffffffffff70;
  
  field_id = (field_id_t)((ulong)in_stack_ffffffffffffff68 >> 0x30);
  fVar3 = (field_id_t)((ulong)in_stack_ffffffffffffff48 >> 0x30);
  operator_new(0xf0);
  SelectNode(in_stack_ffffffffffffff30);
  unique_ptr<duckdb::SelectNode,std::default_delete<duckdb::SelectNode>,true>::
  unique_ptr<std::default_delete<duckdb::SelectNode>,void>
            ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> *)
             in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
            ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> *)
             in_stack_ffffffffffffff30);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (in_stack_ffffffffffffff70,field_id,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
  ;
  unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
            ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> *)
             in_stack_ffffffffffffff30);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>>
            (in_stack_ffffffffffffff50,fVar3,(char *)in_stack_ffffffffffffff40,
             (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
             in_stack_ffffffffffffff38);
  unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
            ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> *)
             in_stack_ffffffffffffff30);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (in_stack_ffffffffffffff50,fVar3,(char *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
            ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> *)
             in_stack_ffffffffffffff30);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (in_stack_ffffffffffffff70,field_id,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
  ;
  puVar2 = in_RSI;
  pDVar1 = (Deserializer *)
           unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)in_stack_ffffffffffffff30);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,true>>
            (pDVar1,(field_id_t)((ulong)puVar2 >> 0x30),in_stack_ffffffffffffff60,
             (vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_true>
              *)in_stack_ffffffffffffff58);
  unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
            ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> *)
             in_stack_ffffffffffffff30);
  Deserializer::ReadProperty<duckdb::AggregateHandling>
            (in_stack_ffffffffffffff40,(field_id_t)((ulong)in_stack_ffffffffffffff38 >> 0x30),
             (char *)in_stack_ffffffffffffff30,(AggregateHandling *)in_stack_ffffffffffffff28);
  puVar2 = in_RSI;
  pDVar1 = (Deserializer *)
           unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)in_stack_ffffffffffffff30);
  fVar3 = (field_id_t)((ulong)puVar2 >> 0x30);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (pDVar1,fVar3,(char *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  puVar2 = in_RSI;
  tag = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                  ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> *)
                   in_stack_ffffffffffffff30);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::SampleOptions,std::default_delete<duckdb::SampleOptions>,true>>
            (pDVar1,fVar3,(char *)tag,
             (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *)
             puVar2);
  this = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                   ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> *
                    )in_stack_ffffffffffffff30);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (pDVar1,fVar3,(char *)tag,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)puVar2);
  unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>::
  unique_ptr<duckdb::SelectNode,std::default_delete<std::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>>>,void>
            ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)this,
             in_RSI);
  unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::~unique_ptr
            ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> *)
             0xae613c);
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<QueryNode> SelectNode::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SelectNode>(new SelectNode());
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(200, "select_list", result->select_list);
	deserializer.ReadPropertyWithDefault<unique_ptr<TableRef>>(201, "from_table", result->from_table);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(202, "where_clause", result->where_clause);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(203, "group_expressions", result->groups.group_expressions);
	deserializer.ReadPropertyWithDefault<vector<GroupingSet>>(204, "group_sets", result->groups.grouping_sets);
	deserializer.ReadProperty<AggregateHandling>(205, "aggregate_handling", result->aggregate_handling);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(206, "having", result->having);
	deserializer.ReadPropertyWithDefault<unique_ptr<SampleOptions>>(207, "sample", result->sample);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(208, "qualify", result->qualify);
	return std::move(result);
}